

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorsTests.cpp
# Opt level: O3

void __thiscall
VectorsTest_Int3SumAssignment_Test::TestBody(VectorsTest_Int3SumAssignment_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  AssertHelper AStack_48;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  int local_38 [2];
  internal local_30 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  undefined8 local_1c;
  int local_14;
  
  local_1c = &DAT_fffffffd00000009;
  local_14 = 0;
  local_40.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_fffffffd00000009;
  local_38[0] = 0;
  testing::internal::CmpHelperEQ<int,int>
            (local_30,"v1.x","Int3(9, -3, 0).x",(int *)&local_1c,(int *)&local_40);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_28.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_28.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/VectorsTests.cpp"
               ,0x38,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_48,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&AStack_48);
    if (local_40.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_40.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_40.ptr_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_40.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &DAT_fffffffd00000009;
    local_38[0] = 0;
    testing::internal::CmpHelperEQ<int,int>
              (local_30,"v1.y","Int3(9, -3, 0).y",(int *)((long)&local_1c + 4),
               (int *)((long)&local_40.ptr_ + 4));
    if (local_30[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_40);
      if (local_28.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((local_28.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&AStack_48,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/VectorsTests.cpp"
                 ,0x38,pcVar2);
      testing::internal::AssertHelper::operator=(&AStack_48,(Message *)&local_40);
      testing::internal::AssertHelper::~AssertHelper(&AStack_48);
      if (local_40.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_40.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_40.ptr_ + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_40.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &DAT_fffffffd00000009;
      local_38[0] = 0;
      testing::internal::CmpHelperEQ<int,int>(local_30,"v1.z","Int3(9, -3, 0).z",&local_14,local_38)
      ;
      if (local_30[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_40);
        if (local_28.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((local_28.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&AStack_48,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/VectorsTests.cpp"
                   ,0x38,pcVar2);
        testing::internal::AssertHelper::operator=(&AStack_48,(Message *)&local_40);
        testing::internal::AssertHelper::~AssertHelper(&AStack_48);
        if (local_40.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_40.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_40.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
  }
  return;
}

Assistant:

TEST(VectorsTest, Int3SumAssignment)
{
    Int3 v1(3, 5, -2), v2(6, -8, 2);
    v1 += v2;
    ASSERT_EQ_INT3(v1, Int3(9, -3, 0));
}